

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealights_ltc_file.cpp
# Opt level: O0

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> __thiscall
alf::read_alf_file(alf *this,string *filename)

{
  int iVar1;
  char *__filename;
  reference pvVar2;
  pointer paVar3;
  undefined1 local_78 [8];
  vector<float,_std::allocator<float>_> texture_slot2;
  undefined1 local_50 [8];
  vector<float,_std::allocator<float>_> texture_slot1;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  uint num_samples;
  alf_header header;
  FILE *file;
  string *filename_local;
  __single_object *alf_file;
  
  __filename = (char *)std::__cxx11::string::c_str();
  header._8_8_ = fopen(__filename,"rb");
  if ((FILE *)header._8_8_ == (FILE *)0x0) {
    std::unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>>::
    unique_ptr<std::default_delete<alf::alf_file>,void>
              ((unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>> *)this,(nullptr_t)0x0);
  }
  else {
    fread(&stack0xffffffffffffffd0,0x10,1,(FILE *)header._8_8_);
    iVar1 = strcmp(&stack0xffffffffffffffd0,"ALF");
    if (iVar1 == 0) {
      texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = header._4_4_ * (int)header.id;
      if (texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        std::unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>>::
        unique_ptr<std::default_delete<alf::alf_file>,void>
                  ((unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_50);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)local_50,
                   (ulong)(uint)((int)header.id * header._4_4_ * 4));
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_50,0);
        fread(pvVar2,0x10,
              (ulong)texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,(FILE *)header._8_8_);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_78);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)local_78,
                   (ulong)(uint)((int)header.id * header._4_4_ * 3));
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_78,0);
        fread(pvVar2,0xc,
              (ulong)texture_slot1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,(FILE *)header._8_8_);
        fclose((FILE *)header._8_8_);
        std::make_unique<alf::alf_file>();
        paVar3 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                           ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)this);
        (paVar3->header).id[0] = uStack_30;
        (paVar3->header).id[1] = uStack_2f;
        (paVar3->header).id[2] = uStack_2e;
        (paVar3->header).id[3] = uStack_2d;
        (paVar3->header).version_major = (undefined2)num_samples;
        (paVar3->header).version_minor = num_samples._2_2_;
        (paVar3->header).num_samples_angle = (uint)header.id;
        (paVar3->header).num_samples_roughness = header._4_4_;
        paVar3 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                           ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)this);
        std::vector<float,_std::allocator<float>_>::operator=
                  (&paVar3->texture_slot1,(vector<float,_std::allocator<float>_> *)local_50);
        paVar3 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                           ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)this);
        std::vector<float,_std::allocator<float>_>::operator=
                  (&paVar3->texture_slot2,(vector<float,_std::allocator<float>_> *)local_78);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_78);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_50);
      }
    }
    else {
      std::unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>>::
      unique_ptr<std::default_delete<alf::alf_file>,void>
                ((unique_ptr<alf::alf_file,std::default_delete<alf::alf_file>> *)this,(nullptr_t)0x0
                );
    }
  }
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)this;
}

Assistant:

std::unique_ptr<alf::alf_file> alf::read_alf_file(const std::string &filename)
{
  auto file = fopen(filename.c_str(), "rb");
  if (!file) {
    return nullptr;
  }

  alf::alf_header header;
  std::fread(&header, sizeof(alf::alf_header), 1, file);

  if (std::strcmp(header.id, "ALF") != 0) {
    return nullptr;
  }

  auto num_samples = header.num_samples_roughness * header.num_samples_angle;
  if (num_samples <= 0) {
    return nullptr;
  }

  std::vector<float> texture_slot1;
  texture_slot1.resize(4 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot1[0], sizeof(float)*4, num_samples, file);

  std::vector<float> texture_slot2;
  texture_slot2.resize(3 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot2[0], sizeof(float)*3, num_samples, file);

  std::fclose(file);

  auto alf_file = std::make_unique<alf::alf_file>();
  alf_file->header = std::move(header);
  alf_file->texture_slot1 = std::move(texture_slot1);
  alf_file->texture_slot2 = std::move(texture_slot2);
  return alf_file;
}